

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  uint32 uVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  UnknownField *field;
  pointer pUVar10;
  ulong uVar11;
  
  pUVar10 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10) >> 4);
  if ((int)uVar8 < 1) {
    sVar7 = 0;
  }
  else {
    uVar11 = (ulong)(uVar8 & 0x7fffffff);
    sVar7 = 0;
    do {
      switch(pUVar10->type_) {
      case 0:
        uVar8 = pUVar10->number_ * 8 + 1;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar9 = (pUVar10->data_).varint_ | 1;
        lVar5 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        sVar7 = ((int)lVar5 * 9 + 0x49U >> 6) + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        break;
      case 1:
        uVar8 = pUVar10->number_ * 8 + 5;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 4;
        break;
      case 2:
        uVar8 = pUVar10->number_ * 8 + 1;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 8;
        break;
      case 3:
        uVar8 = pUVar10->number_ * 8 + 3;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        pUVar2 = *(pointer *)
                  ((long)&(((pUVar10->data_).group_)->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  + 8);
        uVar8 = (uint)pUVar2 | 1;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar7 = (long)&pUVar2->number_ +
                (ulong)(iVar4 * 9 + 0x49U >> 6) + (iVar3 * 9 + 0x49U >> 6) + sVar7;
        break;
      case 4:
        uVar1 = pUVar10->number_;
        uVar8 = uVar1 * 8 + 3;
        iVar3 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar6 = ComputeUnknownFieldsSize((pUVar10->data_).group_);
        uVar8 = uVar1 * 8 + 5;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar7 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + (ulong)(iVar4 * 9 + 0x49U >> 6);
      }
      pUVar10 = pUVar10 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return sVar7;
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}